

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O1

uint32_t Diligent::GetDecorationOffset(Compiler *Compiler,Resource *Res,Decoration Decoration)

{
  bool bVar1;
  char (*in_R8) [30];
  uint32_t offset;
  string msg;
  uint32_t local_44;
  string local_40;
  
  bVar1 = diligent_spirv_cross::Compiler::has_decoration(Compiler,(ID)(Res->id).id,Decoration);
  if (!bVar1) {
    FormatString<char[11],std::__cxx11::string,char[30]>
              (&local_40,(Diligent *)"Resource \'",(char (*) [11])&Res->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\' has no requested decoration",in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetDecorationOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x65);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  local_44 = 0;
  bVar1 = diligent_spirv_cross::Compiler::get_binary_offset_for_decoration
                    (Compiler,(VariableID)(Res->id).id,Decoration,&local_44);
  if (!bVar1) {
    FormatString<char[37]>(&local_40,(char (*) [37])"Requested decoration is not declared");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetDecorationOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return local_44;
}

Assistant:

static uint32_t GetDecorationOffset(const diligent_spirv_cross::Compiler& Compiler,
                                    const diligent_spirv_cross::Resource& Res,
                                    spv::Decoration                       Decoration)
{
    VERIFY(Compiler.has_decoration(Res.id, Decoration), "Resource \'", Res.name, "\' has no requested decoration");
    uint32_t offset   = 0;
    auto     declared = Compiler.get_binary_offset_for_decoration(Res.id, Decoration, offset);
    VERIFY(declared, "Requested decoration is not declared");
    (void)declared;
    return offset;
}